

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall cmMakefileTargetGenerator::CreateRuleFile(cmMakefileTargetGenerator *this)

{
  pointer pcVar1;
  pointer *ppbVar2;
  cmGeneratedFileStream *pcVar3;
  cmLocalUnixMakefileGenerator3 *this_00;
  Encoding encoding;
  int iVar4;
  cmGeneratedFileStream *this_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  undefined1 local_88 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_commands;
  
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xe])
            (local_88,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::operator=((string *)&this->TargetBuildDirectory,(string *)local_88);
  pcVar1 = local_88 + 0x10;
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  cmLocalUnixMakefileGenerator3::ConvertToFullPath
            ((string *)local_88,this->LocalGenerator,&this->TargetBuildDirectory);
  std::__cxx11::string::operator=((string *)&this->TargetBuildDirectoryFull,(string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  cmsys::SystemTools::MakeDirectory(&this->TargetBuildDirectoryFull,(mode_t *)0x0);
  local_88._8_8_ = (this->TargetBuildDirectory)._M_dataplus._M_p;
  local_88._0_8_ = (this->TargetBuildDirectory)._M_string_length;
  local_88._16_8_ = 0xb;
  local_88._24_8_ = "/build.make";
  views._M_len = 2;
  views._M_array = (iterator)local_88;
  cmCatViews_abi_cxx11_((string *)&no_depends,views);
  std::__cxx11::string::operator=((string *)&this->BuildFileName,(string *)&no_depends);
  ppbVar2 = &no_depends.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (no_depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar2) {
    operator_delete(no_depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((no_depends.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  local_88._8_8_ = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  local_88._0_8_ = (this->TargetBuildDirectoryFull)._M_string_length;
  local_88._16_8_ = 0xb;
  local_88._24_8_ = "/build.make";
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_88;
  cmCatViews_abi_cxx11_((string *)&no_depends,views_00);
  std::__cxx11::string::operator=((string *)&this->BuildFileNameFull,(string *)&no_depends);
  if (no_depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar2) {
    operator_delete(no_depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((no_depends.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  local_88._8_8_ = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  local_88._0_8_ = (this->TargetBuildDirectoryFull)._M_string_length;
  local_88._16_8_ = 0xe;
  local_88._24_8_ = "/progress.make";
  views_01._M_len = 2;
  views_01._M_array = (iterator)local_88;
  cmCatViews_abi_cxx11_((string *)&no_depends,views_01);
  std::__cxx11::string::operator=((string *)&this->ProgressFileNameFull,(string *)&no_depends);
  if (no_depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar2) {
    operator_delete(no_depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((no_depends.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  this->NumberOfProgressActions = 0;
  encoding = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
               _vptr_cmGlobalGenerator[5])();
  this_01 = (cmGeneratedFileStream *)operator_new(0x268);
  cmGeneratedFileStream::cmGeneratedFileStream(this_01,&this->BuildFileNameFull,false,encoding);
  pcVar3 = (this->BuildFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  (this->BuildFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = this_01;
  if (pcVar3 != (cmGeneratedFileStream *)0x0) {
    (**(code **)(*(long *)&(pcVar3->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_> + 8))();
  }
  pcVar3 = (this->BuildFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  if (pcVar3 != (cmGeneratedFileStream *)0x0) {
    cmGeneratedFileStream::SetCopyIfDifferent(pcVar3,true);
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              (this->LocalGenerator,
               (ostream *)
               (this->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl);
    iVar4 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
              _vptr_cmGlobalGenerator[0x42])();
    if ((char)iVar4 != '\0') {
      no_depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      no_depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      no_depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      no_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      no_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      no_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      this_00 = this->LocalGenerator;
      pcVar3 = (this->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
      local_88._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,".DELETE_ON_ERROR","");
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (this_00,(ostream *)pcVar3,"Delete rule output on recipe failure.",
                 (string *)local_88,&no_depends,&no_commands,false,false);
      if ((pointer)local_88._0_8_ != pcVar1) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&no_commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&no_depends);
    }
    cmLocalUnixMakefileGenerator3::WriteSpecialTargetsTop
              (this->LocalGenerator,
               (ostream *)
               (this->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateRuleFile()
{
  // Create a directory for this target.
  this->TargetBuildDirectory =
    this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  this->TargetBuildDirectoryFull =
    this->LocalGenerator->ConvertToFullPath(this->TargetBuildDirectory);
  cmSystemTools::MakeDirectory(this->TargetBuildDirectoryFull);

  // Construct the rule file name.
  this->BuildFileName = cmStrCat(this->TargetBuildDirectory, "/build.make");
  this->BuildFileNameFull =
    cmStrCat(this->TargetBuildDirectoryFull, "/build.make");

  // Construct the rule file name.
  this->ProgressFileNameFull =
    cmStrCat(this->TargetBuildDirectoryFull, "/progress.make");

  // reset the progress count
  this->NumberOfProgressActions = 0;

  // Open the rule file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  this->BuildFileStream = cm::make_unique<cmGeneratedFileStream>(
    this->BuildFileNameFull, false,
    this->GlobalGenerator->GetMakefileEncoding());
  if (!this->BuildFileStream) {
    return;
  }
  this->BuildFileStream->SetCopyIfDifferent(true);
  this->LocalGenerator->WriteDisclaimer(*this->BuildFileStream);
  if (this->GlobalGenerator->AllowDeleteOnError()) {
    std::vector<std::string> no_depends;
    std::vector<std::string> no_commands;
    this->LocalGenerator->WriteMakeRule(
      *this->BuildFileStream, "Delete rule output on recipe failure.",
      ".DELETE_ON_ERROR", no_depends, no_commands, false);
  }
  this->LocalGenerator->WriteSpecialTargetsTop(*this->BuildFileStream);
}